

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

demand_unique_ptr_t __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
::pop_demand(work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
             *this)

{
  long in_RSI;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_disp_prio_one_thread_reuse_h_work_thread_hpp:216:7)>
  wait_meter_stopper;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_disp_prio_one_thread_reuse_h_work_thread_hpp:216:7)>
  local_18;
  
  stats::activity_tracking_stuff::
  stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock>::start
            ((stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock> *)
             (in_RSI + 0x40));
  strictly_ordered::impl::demand_queue_t::pop((demand_queue_t *)this);
  details::scope_exit_details::
  at_exit_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/disp/prio_one_thread/reuse/h/work_thread.hpp:216:7)>
  ::~at_exit_t(&local_18);
  return (__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>,_true,_true>
            )this;
}

Assistant:

auto
		pop_demand() -> decltype(std::declval<DEMAND_QUEUE>().pop())
			{
				this->wait_started();
				auto wait_meter_stopper = so_5::details::at_scope_exit(
						[this] { this->wait_finished(); } );

				return this->m_queue.pop();
			}